

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

RegExp * __thiscall re2c::Scanner::mkDefault(Scanner *this)

{
  opt_t *poVar1;
  ulong uVar2;
  Range *m;
  MatchOp *this_00;
  uint32_t u;
  
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  uVar2 = (ulong)(poVar1->encoding).type_;
  u = 0x110000;
  if (uVar2 < 6) {
    u = *(uint32_t *)(&DAT_00151374 + uVar2 * 4);
  }
  m = Range::ran(0,u);
  this_00 = (MatchOp *)operator_new(0x10);
  MatchOp::MatchOp(this_00,m);
  return &this_00->super_RegExp;
}

Assistant:

RegExp * Scanner::mkDefault() const
{
	Range * def = Range::ran (0, opts->encoding.nCodeUnits());
	return new MatchOp(def);
}